

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void Excel::Parser::handleNUMBER(Record *record,size_t sheetIdx,IStorage *storage)

{
  Stream *pSVar1;
  long *in_RDX;
  undefined8 in_RSI;
  Record *in_RDI;
  anon_union_8_2_224970c8 doubleAndLongLong;
  int16_t column;
  int16_t row;
  int32_t in_stack_00000034;
  unsigned_long *in_stack_00000038;
  Stream *in_stack_00000040;
  undefined8 local_28;
  
  Record::dataStream(in_RDI);
  Stream::read<short>(in_stack_00000040,(short *)in_stack_00000038,in_stack_00000034);
  Record::dataStream(in_RDI);
  Stream::read<short>(in_stack_00000040,(short *)in_stack_00000038,in_stack_00000034);
  pSVar1 = Record::dataStream(in_RDI);
  (*pSVar1->_vptr_Stream[4])(pSVar1,2,1);
  Record::dataStream(in_RDI);
  Stream::read<unsigned_long>(in_stack_00000040,in_stack_00000038,in_stack_00000034);
  (**(code **)(*in_RDX + 0x38))(local_28,in_RDX,in_RSI,0,0);
  return;
}

Assistant:

inline void
Parser::handleNUMBER( Record & record, size_t sheetIdx, IStorage & storage )
{
	int16_t row = 0;
	int16_t column = 0;

	record.dataStream().read( row, 2 );
	record.dataStream().read( column, 2 );

	record.dataStream().seek( 2, Stream::FromCurrent );

	union {
		double m_asDouble;
		uint64_t m_asLongLong;
	} doubleAndLongLong;

	record.dataStream().read( doubleAndLongLong.m_asLongLong, 8 );

	storage.onCell( sheetIdx, row, column, doubleAndLongLong.m_asDouble );
}